

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scanner.cpp
# Opt level: O0

int Lodtalk_lex_destroy(yyscan_t yyscanner)

{
  undefined8 local_28;
  undefined8 local_20;
  yyguts_t *yyg;
  yyscan_t yyscanner_local;
  
  while( true ) {
    if (*(long *)((long)yyscanner + 0x28) == 0) {
      local_20 = 0;
    }
    else {
      local_20 = *(long *)(*(long *)((long)yyscanner + 0x28) + *(long *)((long)yyscanner + 0x18) * 8
                          );
    }
    if (local_20 == 0) break;
    if (*(long *)((long)yyscanner + 0x28) == 0) {
      local_28 = (YY_BUFFER_STATE)0x0;
    }
    else {
      local_28 = *(YY_BUFFER_STATE *)
                  (*(long *)((long)yyscanner + 0x28) + *(long *)((long)yyscanner + 0x18) * 8);
    }
    Lodtalk__delete_buffer(local_28,yyscanner);
    *(undefined8 *)(*(long *)((long)yyscanner + 0x28) + *(long *)((long)yyscanner + 0x18) * 8) = 0;
    Lodtalk_pop_buffer_state(yyscanner);
  }
  Lodtalk_free(*(void **)((long)yyscanner + 0x28),yyscanner);
  *(undefined8 *)((long)yyscanner + 0x28) = 0;
  Lodtalk_free(*(void **)((long)yyscanner + 0x60),yyscanner);
  *(undefined8 *)((long)yyscanner + 0x60) = 0;
  yy_init_globals(yyscanner);
  Lodtalk_free(yyscanner,yyscanner);
  return 0;
}

Assistant:

int yylex_destroy  (yyscan_t yyscanner)
{
    struct yyguts_t * yyg = (struct yyguts_t*)yyscanner;

    /* Pop the buffer stack, destroying each element. */
	while(YY_CURRENT_BUFFER){
		yy_delete_buffer( YY_CURRENT_BUFFER , yyscanner );
		YY_CURRENT_BUFFER_LVALUE = NULL;
		yypop_buffer_state(yyscanner);
	}

	/* Destroy the stack itself. */
	yyfree(yyg->yy_buffer_stack , yyscanner);
	yyg->yy_buffer_stack = NULL;

    /* Destroy the start condition stack. */
        yyfree( yyg->yy_start_stack , yyscanner );
        yyg->yy_start_stack = NULL;

    /* Reset the globals. This is important in a non-reentrant scanner so the next time
     * yylex() is called, initialization will occur. */
    yy_init_globals( yyscanner);

    /* Destroy the main struct (reentrant only). */
    yyfree ( yyscanner , yyscanner );
    yyscanner = NULL;
    return 0;
}